

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionVariable.cpp
# Opt level: O3

Error * __thiscall
stick::ConditionVariable::notifyOne(Error *__return_storage_ptr__,ConditionVariable *this)

{
  SystemErrorCode _code;
  int iVar1;
  undefined4 extraout_var;
  String local_40;
  
  if ((this->m_bIsInitialized == false) ||
     (_code = pthread_cond_signal((pthread_cond_t *)this), _code == 0)) {
    stick::Error::Error(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (defaultAllocator()::m_def == '\0') {
    notifyOne();
  }
  local_40.m_allocator = &defaultAllocator::m_def->super_Allocator;
  iVar1 = (*(defaultAllocator::m_def->super_Allocator)._vptr_Allocator[2])
                    (defaultAllocator::m_def,0x1c,1);
  local_40.m_cStr = (char *)CONCAT44(extraout_var,iVar1);
  builtin_strncpy(local_40.m_cStr,"pthread_cond_signal failed.",0x1c);
  local_40.m_capacity = 0x1b;
  local_40.m_length = 0x1b;
  stick::Error::Error<stick::ec::SystemErrorCode>
            (__return_storage_ptr__,_code,&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/ConditionVariable.cpp"
             ,0x1a,(type *)0x0);
  if (local_40.m_cStr == (char *)0x0) {
    return __return_storage_ptr__;
  }
  (*((Allocator *)&(local_40.m_allocator)->_vptr_Allocator)->_vptr_Allocator[3])();
  return __return_storage_ptr__;
}

Assistant:

Error ConditionVariable::notifyOne()
{
    if (!m_bIsInitialized)
        return Error();
#ifdef STICK_PLATFORM_UNIX
    int res = pthread_cond_signal(&m_handle);
    if (res != 0)
        return Error(
            ec::SystemErrorCode(res), "pthread_cond_signal failed.", STICK_FILE, STICK_LINE);
    return Error();
#endif // STICK_PLATFORM_UNIX
}